

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O1

hash_entry_t * hash_detach_entry(adh_node_t *node)

{
  hash_entry_t *phVar1;
  uint uVar2;
  hash_entry **pphVar3;
  
  uVar2 = node->weight % 0x1eef;
  phVar1 = map_weight_nodes.buckets[uVar2];
  if (phVar1 != (hash_entry_t *)0x0) {
    do {
      if (phVar1->value == node) {
        pphVar3 = &phVar1->prev->next;
        if (phVar1->prev == (hash_entry *)0x0) {
          pphVar3 = map_weight_nodes.buckets + uVar2;
        }
        *pphVar3 = phVar1->next;
        if (phVar1->next != (hash_entry *)0x0) {
          phVar1->next->prev = phVar1->prev;
        }
        phVar1->next = (hash_entry *)0x0;
        phVar1->prev = (hash_entry *)0x0;
        return phVar1;
      }
      phVar1 = phVar1->next;
    } while (phVar1 != (hash_entry *)0x0);
  }
  return (hash_entry_t *)0x0;
}

Assistant:

hash_entry_t* hash_detach_entry(adh_node_t *node) {
    int hash_index = hash_get_index(node->weight);

    hash_entry_t  *entry = map_weight_nodes.buckets[hash_index];
    while(entry) {
        if(entry->value == node) {
            if(entry->prev == NULL) {
                map_weight_nodes.buckets[hash_index] = entry->next;
            }
            else {
                entry->prev->next = entry->next;
            }

            if(entry->next)
                entry->next->prev = entry->prev;

            entry->prev = NULL;
            entry->next = NULL;
            return entry;
        }
        entry = entry->next;
    }
    return NULL;
}